

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

bool __thiscall dtc::fdt::property_value::try_to_merge(property_value *this,property_value *other)

{
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator local_28;
  property_value *local_20;
  property_value *other_local;
  property_value *this_local;
  
  local_20 = other;
  other_local = this;
  resolve_type(this);
  switch(this->type) {
  case BINARY:
  case PHANDLE:
    if ((local_20->type == PHANDLE) || (local_20->type == BINARY)) {
      this->type = BINARY;
      local_30._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (&this->byte_data);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_28,&local_30);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (&local_20->byte_data);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_20->byte_data)
      ;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->byte_data,local_28,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      return true;
    }
  default:
    break;
  case EMPTY:
  case UNKNOWN:
    operator=(this,local_20);
  case STRING_LIST:
  case STRING:
  case CROSS_REFERENCE:
  }
  return false;
}

Assistant:

bool
property_value::try_to_merge(property_value &other)
{
	resolve_type();
	switch (type)
	{
		case UNKNOWN:
			__builtin_unreachable();
			assert(0);
			return false;
		case EMPTY:
			*this = other;
			[[fallthrough]];
		case STRING:
		case STRING_LIST:
		case CROSS_REFERENCE:
			return false;
		case PHANDLE:
		case BINARY:
			if (other.type == PHANDLE || other.type == BINARY)
			{
				type = BINARY;
				byte_data.insert(byte_data.end(), other.byte_data.begin(),
				                 other.byte_data.end());
				return true;
			}
	}
	return false;
}